

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall Clasp::DefaultMinimize::attach(DefaultMinimize *this,Solver *s)

{
  Literal p;
  SharedData *pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  byte bVar5;
  wsum_t *pwVar6;
  UndoInfo *__s;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  size_type *psVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint32 numL;
  VarVec up;
  uint local_4c;
  ebo local_48;
  
  local_4c = 0;
  local_48.buf = (pointer)0x0;
  local_48.size = 0;
  local_48.cap = 0;
  pSVar1 = (this->super_MinimizeConstraint).shared_;
  p.rep_ = *(uint32 *)&pSVar1[1].adjust_.ebo_.buf;
  if (3 < p.rep_) {
    psVar11 = &pSVar1[1].adjust_.ebo_.size;
    do {
      bVar5 = *(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc)) & 3;
      if (bVar5 == 0) {
        Solver::addWatch(s,p,(Constraint *)this,local_4c);
      }
      else if (bVar5 == (byte)(2U - ((p.rep_ & 2) == 0))) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
      }
      local_4c = local_4c + 1;
      p.rep_ = *psVar11;
      psVar11 = psVar11 + 2;
    } while (3 < p.rep_);
  }
  uVar8 = this->size_;
  uVar12 = (ulong)uVar8;
  pwVar6 = (wsum_t *)
           operator_new__((ulong)((4 - (uint)(*(uint *)&(this->step_).field_0x4 < 0x40000000)) *
                                 uVar8) << 3);
  this->bounds_ = pwVar6;
  auVar3 = _DAT_001ad1c0;
  auVar2 = _DAT_001ad1b0;
  if (uVar12 != 0) {
    uVar9 = uVar12 + 0x1fffffffffffffff & 0x1fffffffffffffff;
    auVar13._8_4_ = (int)uVar9;
    auVar13._0_8_ = uVar9;
    auVar13._12_4_ = (int)(uVar9 >> 0x20);
    lVar10 = 0;
    auVar13 = auVar13 ^ _DAT_001ad1c0;
    do {
      auVar14._8_4_ = (int)lVar10;
      auVar14._0_8_ = lVar10;
      auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar14 = (auVar14 | auVar2) ^ auVar3;
      if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                  auVar13._4_4_ < auVar14._4_4_) & 1)) {
        pwVar6[lVar10] = 0x7fffffffffffffff;
      }
      if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
          auVar14._12_4_ <= auVar13._12_4_) {
        pwVar6[lVar10 + 1] = 0x7fffffffffffffff;
      }
      lVar10 = lVar10 + 2;
    } while ((uVar9 - ((uint)(uVar12 + 0x1fffffffffffffff) & 1)) + 2 != lVar10);
  }
  if (uVar8 != uVar8 * 3) {
    memset(pwVar6 + uVar12,0,(ulong)(uVar8 * 3) * 8 + uVar12 * -8);
  }
  stepInit(this,0);
  uVar4 = local_4c;
  uVar8 = local_4c * 2;
  __s = (UndoInfo *)operator_new__((ulong)uVar8 * 4 + 4);
  memset(__s,0,(ulong)uVar8 * 4 + 4);
  this->undo_ = __s;
  this->undoTop_ = 0;
  this->posTop_ = uVar4 + 1;
  this->actLev_ = 0;
  if (local_48.size != 0) {
    uVar8 = 0;
    uVar7 = extraout_RDX;
    do {
      propagate(this,s,(Literal)(uint32)uVar7,local_48.buf + uVar8);
      uVar8 = uVar8 + 1;
      uVar7 = extraout_RDX_00;
    } while (uVar8 != local_48.size);
  }
  if (local_48.buf != (pointer)0x0) {
    operator_delete(local_48.buf);
  }
  return true;
}

Assistant:

bool DefaultMinimize::attach(Solver& s) {
	assert(s.decisionLevel() == 0 && !bounds_);
	uint32 numL = 0;
	VarVec up;
	for (const WeightLiteral* it = shared_->lits; !isSentinel(it->first); ++it, ++numL) {
		if (s.value(it->first.var()) == value_free) {
			s.addWatch(it->first, this, numL);
		}
		else if (s.isTrue(it->first)) {
			up.push_back(numL);
		}
	}
	bounds_ = new wsum_t[(numRules() * (3 + uint32(step_.type != 0)))]; // upper, sum, temp, lower
	std::fill(this->opt(), this->sum(), SharedData::maxBound());
	std::fill(this->sum(), this->end(), wsum_t(0));
	stepInit(0);
	// [0,numL+1)      : undo stack
	// [numL+1, numL*2): pos  stack
	undo_    = new UndoInfo[(numL*2)+1];
	undoTop_ = 0;
	posTop_  = numL+1;
	actLev_  = 0;
	for (WeightVec::size_type i = 0; i != up.size(); ++i) {
		DefaultMinimize::propagate(s, shared_->lits[up[i]].first, up[i]);
	}
	return true;
}